

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O3

void __thiscall
Units_unitAttributeReference_Test::~Units_unitAttributeReference_Test
          (Units_unitAttributeReference_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Units, unitAttributeReference)
{
    libcellml::UnitsPtr u = libcellml::Units::create();

    EXPECT_EQ("", u->unitAttributeReference(0));
    u->addUnit("NewUnit", 4, 1.05, 17.0);

    EXPECT_EQ("NewUnit", u->unitAttributeReference(0));
    EXPECT_EQ("", u->unitAttributeReference(4));

    u->setUnitAttributeReference(0, "NewerUnit");
    EXPECT_EQ("NewerUnit", u->unitAttributeReference(0));

    u->setUnitAttributeReference(3, "FreshUnit");
    EXPECT_EQ("", u->unitAttributeReference(3));
    EXPECT_EQ("NewerUnit", u->unitAttributeReference(0));
}